

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

int slang::ast::Pattern::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sockaddr *__addr_00;
  undefined4 in_register_0000003c;
  WildcardPatternSyntax *syntax;
  Pattern *result;
  ASTContext *in_stack_00000038;
  Type *in_stack_00000040;
  TaggedPatternSyntax *in_stack_00000048;
  ASTContext *in_stack_00000060;
  VariablePatternSyntax *in_stack_00000068;
  ASTContext *in_stack_000000a8;
  Type *in_stack_000000b0;
  ExpressionPatternSyntax *in_stack_000000b8;
  ASTContext *in_stack_000002e8;
  Type *in_stack_000002f0;
  StructurePatternSyntax *in_stack_000002f8;
  Pattern *local_28;
  int local_8;
  
  syntax = (WildcardPatternSyntax *)CONCAT44(in_register_0000003c,__fd);
  iVar1._0_2_ = __addr->sa_family;
  iVar1._2_1_ = __addr->sa_data[0];
  iVar1._3_1_ = __addr->sa_data[1];
  if (iVar1 == 199) {
    slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>((SyntaxNode *)__addr);
    local_28 = ConstantPattern::fromSyntax(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  }
  else {
    if (iVar1 == 0x168) {
      slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedPatternSyntax>((SyntaxNode *)__addr)
      ;
      __addr_00 = (sockaddr *)
                  not_null<slang::syntax::PatternSyntax_*>::operator*
                            ((not_null<slang::syntax::PatternSyntax_*> *)0x48cf4c);
      iVar1 = bind(__fd,__addr_00,__len);
      return iVar1;
    }
    if (iVar1 == 0x1c1) {
      slang::syntax::SyntaxNode::as<slang::syntax::StructurePatternSyntax>((SyntaxNode *)__addr);
      local_28 = StructurePattern::fromSyntax(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8)
      ;
    }
    else if (iVar1 == 0x1c9) {
      slang::syntax::SyntaxNode::as<slang::syntax::TaggedPatternSyntax>((SyntaxNode *)__addr);
      local_28 = TaggedPattern::fromSyntax(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    }
    else if (iVar1 == 0x203) {
      slang::syntax::SyntaxNode::as<slang::syntax::VariablePatternSyntax>((SyntaxNode *)__addr);
      local_28 = VariablePattern::fromSyntax(in_stack_00000068,in_stack_00000060);
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::WildcardPatternSyntax>((SyntaxNode *)__addr);
      local_28 = WildcardPattern::fromSyntax(syntax,(ASTContext *)__addr);
    }
  }
  local_28->syntax = (SyntaxNode *)__addr;
  local_8 = (int)local_28;
  return local_8;
}

Assistant:

Pattern& Pattern::bind(const ASTContext& context, const syntax::PatternSyntax& syntax,
                       const Type& targetType) {
    Pattern* result;
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedPattern:
            return bind(context, *syntax.as<ParenthesizedPatternSyntax>().pattern, targetType);
        case SyntaxKind::WildcardPattern:
            result = &WildcardPattern::fromSyntax(syntax.as<WildcardPatternSyntax>(), context);
            break;
        case SyntaxKind::ExpressionPattern:
            result = &ConstantPattern::fromSyntax(syntax.as<ExpressionPatternSyntax>(), targetType,
                                                  context);
            break;
        case SyntaxKind::VariablePattern:
            result = &VariablePattern::fromSyntax(syntax.as<VariablePatternSyntax>(), context);
            break;
        case SyntaxKind::TaggedPattern:
            result = &TaggedPattern::fromSyntax(syntax.as<TaggedPatternSyntax>(), targetType,
                                                context);
            break;
        case SyntaxKind::StructurePattern:
            result = &StructurePattern::fromSyntax(syntax.as<StructurePatternSyntax>(), targetType,
                                                   context);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}